

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O3

void initSystem(int begX,int begY)

{
  int iVar1;
  WINDOW *pWVar2;
  undefined8 uVar3;
  arrow *paVar4;
  pointer pnVar5;
  int iVar6;
  ulong uVar7;
  arrowType **ppaVar8;
  int iVar9;
  char *__end;
  ulong uVar10;
  uint8_t nId;
  long lVar11;
  int iVar12;
  pointer pnVar13;
  int local_104;
  undefined1 local_d8 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  local_68 [2];
  
  startX = begX;
  startY = begY;
  if (0 < grid_size[0]) {
    local_104 = 0;
    iVar6 = 0;
    iVar9 = grid_size[0];
    iVar12 = grid_size[1];
    do {
      if (0 < iVar12) {
        lVar11 = (long)iVar6 * 0xa8;
        iVar12 = startX + 0x1c;
        iVar9 = 0;
        do {
          nId = (char)iVar6 + (char)iVar9;
          node::node((node *)local_d8,nId);
          std::vector<node,_std::allocator<node>_>::emplace_back<node>(&grid,(node *)local_d8);
          std::__cxx11::
          _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
          ::_M_clear(local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_80);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_98);
          pWVar2 = new_bwin(0xb,0x1a,begY,iVar12 + -0x1b);
          *(WINDOW **)
           ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                   super__Vector_impl_data._M_start)->arrows + lVar11 + -0x80) = pWVar2;
          uVar3 = newwin(9,4,begY + 1,iVar12 + -6);
          *(undefined8 *)
           ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                   super__Vector_impl_data._M_start)->arrows + lVar11 + -0x70) = uVar3;
          uVar3 = newwin(9,0x12,begY + 1,iVar12 + -0x1a);
          *(undefined8 *)
           ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                   super__Vector_impl_data._M_start)->arrows + lVar11 + -0x78) = uVar3;
          pWVar2 = new_bwin(0xb,0x14,begY,iVar12 + -0x1b);
          pnVar5 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(WINDOW **)
           ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                   super__Vector_impl_data._M_start)->arrows + lVar11 + -0x60) = pWVar2;
          wprintw(*(undefined8 *)((long)pnVar5->arrows + lVar11 + -0x70)," ACC%d\n BAK%d",
                  (int)*(short *)((long)pnVar5->arrows + lVar11 + -0x56),
                  (int)*(short *)((long)pnVar5->arrows + lVar11 + -0x54));
          wrefresh(*(undefined8 *)
                    ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                            super__Vector_impl_data._M_start)->arrows + lVar11 + -0x70));
          refresh();
          iVar1 = grid_size[1];
          if (local_104 != 0) {
            *(undefined8 *)
             ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_start)->arrows + lVar11) =
                 *(undefined8 *)
                  ((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                         super__Vector_impl_data._M_start[-(long)grid_size[1]].arrows +
                  lVar11 + 0x10);
          }
          if (iVar9 != iVar1 + -1) {
            paVar4 = (arrow *)operator_new(0x20);
            arrow::arrow(paVar4,nId,(char)iVar6 + (char)iVar9 + '\x01',begY + 3,iVar12,false);
            *(arrow **)
             ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_start)->arrows + lVar11 + 8) = paVar4;
            ppaVar8 = (arrowType **)
                      ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                              super__Vector_impl_data._M_start)->arrows + lVar11 + 8);
            if (gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<arrowType*,std::allocator<arrowType*>>::
              _M_realloc_insert<arrowType*const&>
                        ((vector<arrowType*,std::allocator<arrowType*>> *)&gridArrows,
                         (iterator)
                         gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,ppaVar8);
            }
            else {
              *gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
               super__Vector_impl_data._M_finish = *ppaVar8;
              gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          iVar1 = grid_size[0];
          if (local_104 != grid_size[0] + -1) {
            paVar4 = (arrow *)operator_new(0x20);
            arrow::arrow(paVar4,nId,(char)iVar1 + nId,begY + 0xb,iVar12 + -0x14,true);
            *(arrow **)
             ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_start)->arrows + lVar11 + 0x10) = paVar4;
            ppaVar8 = (arrowType **)
                      ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                              super__Vector_impl_data._M_start)->arrows + lVar11 + 0x10);
            if (gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<arrowType*,std::allocator<arrowType*>>::
              _M_realloc_insert<arrowType*const&>
                        ((vector<arrowType*,std::allocator<arrowType*>> *)&gridArrows,
                         (iterator)
                         gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,ppaVar8);
            }
            else {
              *gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
               super__Vector_impl_data._M_finish = *ppaVar8;
              gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          if (iVar9 != 0) {
            *(undefined8 *)
             ((long)(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                     super__Vector_impl_data._M_start)->arrows + lVar11 + 0x18) =
                 *(undefined8 *)
                  ((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar11 + -0x18);
          }
          iVar9 = iVar9 + 1;
          lVar11 = lVar11 + 0xa8;
          iVar12 = iVar12 + 0x20;
        } while (iVar9 < grid_size[1]);
        iVar6 = iVar6 + iVar9;
        iVar9 = grid_size[0];
        iVar12 = grid_size[1];
      }
      begY = begY + 0xc;
      local_104 = local_104 + 1;
    } while (local_104 < iVar9);
  }
  iVar6 = startX;
  playButton = (WINDOW *)newwin(3,5,begY,startX + 1);
  wbkgd(playButton,0x200);
  mvwprintw(playButton,1,0,"PLAY");
  wrefresh(playButton);
  stopButton = (WINDOW *)newwin(3,5,begY,iVar6 + 7);
  wbkgd(stopButton,0x300);
  mvwprintw(stopButton,1,0,"STOP");
  wrefresh(stopButton);
  pauseButton = (WINDOW *)newwin(3,5,begY,iVar6 + 0xd);
  wbkgd(pauseButton,0x400);
  mvwprintw(pauseButton,1,0,"PAUSE");
  wrefresh(pauseButton);
  decreaseDelayButton = (WINDOW *)newwin(3,5,begY,iVar6 + 0x14);
  wbkgd(decreaseDelayButton,0x100);
  mvwprintw(decreaseDelayButton,1,2,anon_var_dwarf_66db7);
  wrefresh(decreaseDelayButton);
  increaseDelayButton = (WINDOW *)newwin(3,5,begY,iVar6 + 0x1a);
  wbkgd(increaseDelayButton,0x100);
  mvwprintw(increaseDelayButton,1,2,"+");
  wrefresh(increaseDelayButton);
  pWVar2 = (WINDOW *)newwin(1,5,begY + 1,iVar6 + 0x20);
  delayValueWindow = pWVar2;
  intToString_abi_cxx11_((string *)local_d8,tickDelay);
  mvwprintw(pWVar2,0,0,"%s",local_d8._0_8_);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
  }
  wrefresh(delayValueWindow);
  if (grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data._M_finish
      != grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    lVar11 = 0x40;
    uVar10 = 0;
    pnVar5 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pnVar13 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
              _M_start;
    do {
      if (*(long *)((long)pnVar13->arrows + lVar11 + -0x80) == *(long *)(&pnVar13->nodeId + lVar11))
      {
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (&pnVar13->nodeId + lVar11),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        pnVar5 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pnVar13 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          pnVar5 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pnVar13 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
      uVar10 = uVar10 + 1;
      uVar7 = ((long)pnVar5 - (long)pnVar13 >> 3) * -0x30c30c30c30c30c3;
      lVar11 = lVar11 + 0xa8;
    } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
  }
  refresh();
  return;
}

Assistant:

void initSystem(int begX, int begY) {
	startX = begX;
	startY = begY;
  int c, x, y, id;
  int max_x, max_y;
  int nID=0;
  WINDOW *menu;

  getmaxyx(stdscr, max_y, max_x);

  y = startY;
  for(int i=0;i<grid_size[0]; i++){
    x = startX + GAP_WIDTH_H;
    for(int j=0;j<grid_size[1];j++){
      grid.push_back(node(nID));
      grid[nID].w_main=new_bwin(NODE_HEIGHT, NODE_WIDTH, y, x);
      grid[nID].w_reg =newwin(NODE_HEIGHT-2,NODE_WIDTH-CODE_WIDTH-2, y+1, x+CODE_WIDTH+1);
      grid[nID].w_code=newwin(NODE_HEIGHT - 2, CODE_WIDTH - 2, y + 1 , x + 1);
      grid[nID].w_divider=new_bwin(NODE_HEIGHT, CODE_WIDTH, y, x);

      wprintw(grid[nID].w_reg, " ACC%d\n BAK%d", grid[nID].acc, grid[nID].bak);
      wrefresh(grid[nID].w_reg);
      refresh();

      if (i != 0) {
      	grid[nID].arrows[0] = grid[nID - grid_size[1]].arrows[2];
      }

      if (j != grid_size[1] - 1) {
      	grid[nID].arrows[1] = new arrow(nID, nID + 1, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x + NODE_WIDTH + GAP_WIDTH_H, false);
      	gridArrows.push_back(grid[nID].arrows[1]);
      }

      if (i != grid_size[0] - 1) {
      	grid[nID].arrows[2] = new arrow(nID, nID + grid_size[0], y + NODE_HEIGHT + GAP_WIDTH_V, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), true);
	gridArrows.push_back(grid[nID].arrows[2]);
      }

      if (j != 0) {
      	grid[nID].arrows[3] = grid[nID - 1].arrows[1];
      }
      nID++;
      x = x + NODE_WIDTH + ARROW_H_WIDTH + 2 * GAP_WIDTH_H;
    }
    y=y+(NODE_HEIGHT+2*GAP_WIDTH_V+ARROW_V_HEIGHT);
  }

  x = startX + GAP_WIDTH_H;
  playButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(playButton, COLOR_PAIR(2));
  mvwprintw(playButton, BUTTON_HEIGHT/2,0,"PLAY");
  wrefresh(playButton);
  x += BUTTON_WIDTH + GAP_WIDTH_H;

  stopButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(stopButton, COLOR_PAIR(3));
  mvwprintw(stopButton, BUTTON_HEIGHT/2,0,"STOP");
  wrefresh(stopButton);

  x += BUTTON_WIDTH + GAP_WIDTH_H;
  pauseButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(pauseButton, COLOR_PAIR(4));
  mvwprintw(pauseButton, BUTTON_HEIGHT/2,0,"PAUSE");
  wrefresh(pauseButton);


  x += BUTTON_WIDTH + GAP_WIDTH_H * 2;
	decreaseDelayButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
	wbkgd(decreaseDelayButton, COLOR_PAIR(1));
	mvwprintw(decreaseDelayButton, 1, 2, "–");
	wrefresh(decreaseDelayButton);
	
  x += BUTTON_WIDTH + GAP_WIDTH_H;
  increaseDelayButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(increaseDelayButton, COLOR_PAIR(1));
	mvwprintw(increaseDelayButton, 1, 2, "+");
  wrefresh(increaseDelayButton);

  x += BUTTON_WIDTH + GAP_WIDTH_H;
  delayValueWindow = newwin(1, 5, y + 1, x);
  mvwprintw(delayValueWindow, 0, 0, "%s", intToString(tickDelay).c_str());
  wrefresh(delayValueWindow);
  
  for(int i=0; i < grid.size(); i++){
		if(grid[i].inputCode.size() == 0)
			grid[i].inputCode.push_back("");
  }

  refresh();

  return;
}